

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Specifiers.cpp
# Opt level: O2

Action __thiscall
psy::C::DeclarationBinder::visit_AtSpecifiers_COMMON<psy::C::VariableAndOrFunctionDeclarationSyntax>
          (DeclarationBinder *this,VariableAndOrFunctionDeclarationSyntax *node,
          offset_in_DeclarationBinder_to_subr visit_AtDeclarators)

{
  SpecifierListSyntax *pSVar1;
  Action AVar2;
  int iVar3;
  undefined4 extraout_var;
  Type *ty;
  undefined4 extraout_var_00;
  long in_RCX;
  long *plVar4;
  SpecifierListSyntax **ppSVar5;
  SpecifierListSyntax **ppSVar6;
  SyntaxToken local_68;
  
  *(byte *)&this->field_7 = *(byte *)&this->field_7 & 0xf1;
  ppSVar5 = &node->specs_;
  ppSVar6 = ppSVar5;
  while( true ) {
    pSVar1 = *ppSVar6;
    if (pSVar1 == (SpecifierListSyntax *)0x0) {
      if ((this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          (this->tys_).c.super__Deque_base<psy::C::Type_*,_std::allocator<psy::C::Type_*>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        C::SyntaxNode::lastToken(&local_68,(SyntaxNode *)node);
        DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt(&this->diagReporter_,&local_68);
        SyntaxToken::~SyntaxToken(&local_68);
        ty = &makeType<psy::C::BasicType,psy::C::BasicTypeKind>(this,Int_S)->super_Type;
        pushType(this,ty);
      }
      while( true ) {
        pSVar1 = *ppSVar5;
        if (pSVar1 == (SpecifierListSyntax *)0x0) {
          plVar4 = (long *)((long)&(this->super_SyntaxVisitor)._vptr_SyntaxVisitor + in_RCX);
          if ((visit_AtDeclarators & 1) != 0) {
            visit_AtDeclarators = *(undefined8 *)(*plVar4 + -1 + visit_AtDeclarators);
          }
          AVar2 = (*(code *)visit_AtDeclarators)(plVar4,node);
          return AVar2;
        }
        iVar3 = (*(((pSVar1->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x3a])();
        if ((CONCAT44(extraout_var_00,iVar3) != 0) &&
           (AVar2 = SyntaxVisitor::visit
                              (&this->super_SyntaxVisitor,
                               &((pSVar1->
                                 super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                 ).
                                 super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                                .value)->super_SyntaxNode), AVar2 == Quit)) break;
        ppSVar5 = &(pSVar1->
                   super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   ).
                   super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                   .next;
      }
      return Quit;
    }
    iVar3 = (*(((pSVar1->
                super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                ).
                super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x3a])();
    if ((CONCAT44(extraout_var,iVar3) == 0) &&
       (AVar2 = SyntaxVisitor::visit
                          (&this->super_SyntaxVisitor,
                           &((pSVar1->
                             super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                             ).
                             super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                            .value)->super_SyntaxNode), AVar2 == Quit)) break;
    ppSVar6 = &(pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next;
  }
  return Quit;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visit_AtSpecifiers_COMMON(
        const NodeT* node,
        Action (DeclarationBinder::*visit_AtDeclarators)(const NodeT*))
{
    F_.inImplicitIntTySpec_ = false;
    F_.inImplicitDoubleTySpec_ = false;
    F_.inExplicitSignedOrUnsignedTySpec_ = false;

    for (auto specIt = node->specifiers(); specIt; specIt = specIt->next) {
        if (!specIt->value->asTypeQualifier())
            VISIT(specIt->value);
    }

    if (tys_.empty()) {
        diagReporter_.TypeSpecifierMissingDefaultsToInt(node->lastToken());
        pushType(makeType<BasicType>(BasicTypeKind::Int_S));
    }

    for (auto specIt = node->specifiers(); specIt; specIt = specIt->next) {
        if (specIt->value->asTypeQualifier())
            VISIT(specIt->value);
    }

    return ((this)->*(visit_AtDeclarators))(node);
}